

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

bool __thiscall duckdb::ConflictManager::SingleIndexTarget(ConflictManager *this)

{
  ConflictInfo *pCVar1;
  
  pCVar1 = optional_ptr<duckdb::ConflictInfo,_true>::operator->(&this->conflict_info);
  return (pCVar1->column_ids->_M_h)._M_element_count != 0;
}

Assistant:

bool ConflictManager::SingleIndexTarget() const {
	D_ASSERT(conflict_info);
	// We are only interested in a specific index
	return !conflict_info->column_ids.empty();
}